

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlWalkValidateList(void *data,void *user)

{
  xmlValidCtxtPtr ctxt;
  xmlChar *cur;
  long lVar1;
  xmlAttrPtr pxVar2;
  byte *pbVar3;
  byte bVar4;
  xmlValidateMemoPtr memo;
  byte *pbVar5;
  byte *pbVar6;
  
  if (data == (void *)0x0) {
    return 1;
  }
  ctxt = *user;
  cur = *(xmlChar **)((long)user + 8);
  lVar1 = *(long *)((long)data + 0x10);
  if (lVar1 == 0) {
    if (*(long *)((long)data + 0x18) == 0) {
      return 1;
    }
    pbVar3 = xmlStrdup(cur);
    if (pbVar3 == (byte *)0x0) {
      xmlVErrMemory(ctxt);
      return 1;
    }
    bVar4 = *pbVar3;
    pbVar6 = pbVar3;
    pbVar5 = pbVar3;
    if (bVar4 != 0) {
      do {
        while ((0x20 < bVar4 || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0))) {
          bVar4 = pbVar6[1];
          pbVar6 = pbVar6 + 1;
        }
        *pbVar6 = 0;
        pxVar2 = xmlGetID(ctxt->doc,pbVar5);
        if (pxVar2 == (xmlAttrPtr)0x0) {
          xmlDoErrValid(ctxt,(xmlNodePtr)0x0,XML_DTD_UNKNOWN_ID,2,*(xmlChar **)((long)data + 0x18),
                        pbVar5,(xmlChar *)0x0,*(uint *)((long)data + 0x20),
                        "attribute %s line %d references an unknown ID \"%s\"\n",
                        *(xmlChar **)((long)data + 0x18),(ulong)*(uint *)((long)data + 0x20),pbVar5)
          ;
          ctxt->valid = 0;
        }
        if (bVar4 == 0) break;
        *pbVar6 = bVar4;
        while (pbVar5 = pbVar6, bVar4 < 0x21) {
          if ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) == 0) {
            if ((ulong)bVar4 == 0) goto LAB_0015af58;
            break;
          }
          pbVar5 = pbVar6 + 1;
          pbVar6 = pbVar6 + 1;
          bVar4 = *pbVar5;
        }
      } while( true );
    }
  }
  else {
    if (*(int *)(lVar1 + 0x50) != 4) {
      if (*(int *)(lVar1 + 0x50) != 3) {
        return 1;
      }
      pxVar2 = xmlGetID(ctxt->doc,cur);
      if (pxVar2 != (xmlAttrPtr)0x0) {
        return 1;
      }
      xmlDoErrValid(ctxt,*(xmlNodePtr *)(lVar1 + 0x28),XML_DTD_UNKNOWN_ID,2,
                    *(xmlChar **)(lVar1 + 0x10),cur,(xmlChar *)0x0,0,
                    "IDREF attribute %s references an unknown ID \"%s\"\n",
                    *(xmlChar **)(lVar1 + 0x10),cur,0);
      ctxt->valid = 0;
      return 1;
    }
    pbVar3 = xmlStrdup(cur);
    if (pbVar3 == (byte *)0x0) {
      xmlVErrMemory(ctxt);
      ctxt->valid = 0;
      return 1;
    }
    bVar4 = *pbVar3;
    pbVar6 = pbVar3;
    pbVar5 = pbVar3;
    if (bVar4 != 0) {
      do {
        while ((0x20 < bVar4 || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0))) {
          bVar4 = pbVar6[1];
          pbVar6 = pbVar6 + 1;
        }
        *pbVar6 = 0;
        pxVar2 = xmlGetID(ctxt->doc,pbVar5);
        if (pxVar2 == (xmlAttrPtr)0x0) {
          xmlDoErrValid(ctxt,*(xmlNodePtr *)(lVar1 + 0x28),XML_DTD_UNKNOWN_ID,2,
                        *(xmlChar **)(lVar1 + 0x10),pbVar5,(xmlChar *)0x0,0,
                        "IDREFS attribute %s references an unknown ID \"%s\"\n",
                        *(xmlChar **)(lVar1 + 0x10),pbVar5,0);
          ctxt->valid = 0;
        }
        if (bVar4 == 0) break;
        *pbVar6 = bVar4;
        while (pbVar5 = pbVar6, bVar4 < 0x21) {
          if ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) == 0) {
            if ((ulong)bVar4 == 0) goto LAB_0015af58;
            break;
          }
          pbVar5 = pbVar6 + 1;
          pbVar6 = pbVar6 + 1;
          bVar4 = *pbVar5;
        }
      } while( true );
    }
  }
LAB_0015af58:
  (*xmlFree)(pbVar3);
  return 1;
}

Assistant:

static void
xmlValidateRef(xmlRefPtr ref, xmlValidCtxtPtr ctxt,
	                   const xmlChar *name) {
    xmlAttrPtr id;
    xmlAttrPtr attr;

    if (ref == NULL)
	return;
    if ((ref->attr == NULL) && (ref->name == NULL))
	return;
    attr = ref->attr;
    if (attr == NULL) {
	xmlChar *dup, *str = NULL, *cur, save;

	dup = xmlStrdup(name);
	if (dup == NULL) {
            xmlVErrMemory(ctxt);
	    return;
	}
	cur = dup;
	while (*cur != 0) {
	    str = cur;
	    while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
	    save = *cur;
	    *cur = 0;
	    id = xmlGetID(ctxt->doc, str);
	    if (id == NULL) {
		xmlErrValidNodeNr(ctxt, NULL, XML_DTD_UNKNOWN_ID,
	   "attribute %s line %d references an unknown ID \"%s\"\n",
		       ref->name, ref->lineno, str);
		ctxt->valid = 0;
	    }
	    if (save == 0)
		break;
	    *cur = save;
	    while (IS_BLANK_CH(*cur)) cur++;
	}
	xmlFree(dup);
    } else if (attr->atype == XML_ATTRIBUTE_IDREF) {
	id = xmlGetID(ctxt->doc, name);
	if (id == NULL) {
	    xmlErrValidNode(ctxt, attr->parent, XML_DTD_UNKNOWN_ID,
	   "IDREF attribute %s references an unknown ID \"%s\"\n",
		   attr->name, name, NULL);
	    ctxt->valid = 0;
	}
    } else if (attr->atype == XML_ATTRIBUTE_IDREFS) {
	xmlChar *dup, *str = NULL, *cur, save;

	dup = xmlStrdup(name);
	if (dup == NULL) {
	    xmlVErrMemory(ctxt);
	    ctxt->valid = 0;
	    return;
	}
	cur = dup;
	while (*cur != 0) {
	    str = cur;
	    while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
	    save = *cur;
	    *cur = 0;
	    id = xmlGetID(ctxt->doc, str);
	    if (id == NULL) {
		xmlErrValidNode(ctxt, attr->parent, XML_DTD_UNKNOWN_ID,
	   "IDREFS attribute %s references an unknown ID \"%s\"\n",
			     attr->name, str, NULL);
		ctxt->valid = 0;
	    }
	    if (save == 0)
		break;
	    *cur = save;
	    while (IS_BLANK_CH(*cur)) cur++;
	}
	xmlFree(dup);
    }
}